

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtAlignedObjectArray<const_cbtDbvtNode_*>_>::copy
          (cbtAlignedObjectArray<cbtAlignedObjectArray<const_cbtDbvtNode_*>_> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  int extraout_EAX;
  long in_RCX;
  long lVar1;
  long lVar2;
  
  lVar2 = (long)(int)dst;
  lVar1 = lVar2 << 5;
  for (; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::cbtAlignedObjectArray
              ((cbtAlignedObjectArray<const_cbtDbvtNode_*> *)(in_RCX + lVar1),
               (cbtAlignedObjectArray<const_cbtDbvtNode_*> *)(&this->m_data->field_0x0 + lVar1));
    lVar1 = lVar1 + 0x20;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}